

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::extractClassName_abi_cxx11_
          (string *__return_storage_ptr__,Catch *this,StringRef *classOrQualifiedMethodName)

{
  long lVar1;
  long lVar2;
  long *local_40 [2];
  long local_30 [2];
  
  lVar2 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     (*(__return_storage_ptr__->_M_dataplus)._M_p == '&')) {
    lVar2 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x16a813,0xffffffffffffffff);
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x16a813,lVar2 - 1);
    std::__cxx11::string::substr((ulong)local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractClassName( StringRef const& classOrQualifiedMethodName ) {
        std::string className(classOrQualifiedMethodName);
        if( startsWith( className, '&' ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }